

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O3

void OutputFlatDependencies
               (Configuration *config,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
               *components,path *outfile)

{
  ostream *poVar1;
  ulong uVar2;
  size_t sVar3;
  string *psVar4;
  _Hash_node_base *p_Var5;
  ostream *poVar6;
  char *__s;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  pair<std::_Rb_tree_iterator<Component_*>,_bool> pVar9;
  set<Component_*,_std::less<Component_*>,_std::allocator<Component_*>_> depcomps;
  OstreamHolder outHolder;
  char local_2b1;
  string local_2b0;
  string local_290;
  Configuration *local_270;
  string local_268;
  size_type *local_248;
  undefined8 local_240;
  undefined1 local_238 [256];
  undefined8 local_138 [33];
  
  local_270 = config;
  OstreamHolder::OstreamHolder((OstreamHolder *)local_238,outfile);
  if (local_238[0] == false) {
    poVar6 = (ostream *)(local_238 + 8);
  }
  else {
    poVar6 = (ostream *)&std::cout;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"digraph dependencies {",0x16);
  local_268._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_268,1);
  p_Var8 = (components->_M_h)._M_before_begin._M_nxt;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    do {
      p_Var5 = p_Var8[5]._M_nxt;
      if (((_Hash_node_base *)0x2 < p_Var5[1]._M_nxt) &&
         (p_Var5[0x34]._M_nxt != (_Hash_node_base *)0x0)) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
        Component::QuotedName_abi_cxx11_(&local_268,(Component *)p_Var8[5]._M_nxt);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)CONCAT71(local_268._M_dataplus._M_p._1_7_,
                                                    local_268._M_dataplus._M_p._0_1_),
                            CONCAT44(local_268._M_string_length._4_4_,
                                     (undefined4)local_268._M_string_length));
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," [shape=",8);
        p_Var5 = p_Var8[5]._M_nxt[0x33]._M_nxt;
        __s = "oval";
        if (p_Var5 != (_Hash_node_base *)0x0) {
          uVar2 = 0;
          do {
            p_Var7 = p_Var5 + 1;
            p_Var5 = p_Var5->_M_nxt;
            uVar2 = (long)&(p_Var7->_M_nxt[0x19]._M_nxt)->_M_nxt + uVar2;
          } while (p_Var5 != (_Hash_node_base *)0x0);
          __s = "oval";
          if ((((999 < uVar2) && (__s = "doublecircle", 4999 < uVar2)) &&
              (__s = "octagon", 19999 < uVar2)) && (__s = "tripleoctagon", uVar2 < 50000)) {
            __s = "doubleoctagon";
          }
        }
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_268._M_dataplus._M_p._1_7_,local_268._M_dataplus._M_p._0_1_) !=
            &local_268.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_268._M_dataplus._M_p._1_7_,local_268._M_dataplus._M_p._0_1_
                                  ));
        }
        p_Var5 = p_Var8[5]._M_nxt;
      }
      local_268._M_string_length._0_4_ = 0;
      local_268.field_2._M_allocated_capacity = 0;
      local_268.field_2._8_8_ = &local_268._M_string_length;
      local_240 = 0;
      p_Var7 = p_Var5[0x11]._M_nxt;
      local_248 = (size_type *)local_268.field_2._8_8_;
      if (p_Var7 != (_Hash_node_base *)0x0) {
        do {
          if (((_Hash_node_base *)0x2 < p_Var7[1]._M_nxt[1]._M_nxt) &&
             (p_Var7[1]._M_nxt[0x34]._M_nxt != (_Hash_node_base *)0x0)) {
            p_Var5 = p_Var7 + 1;
            pVar9 = std::
                    _Rb_tree<Component*,Component*,std::_Identity<Component*>,std::less<Component*>,std::allocator<Component*>>
                    ::_M_insert_unique<Component*const&>
                              ((_Rb_tree<Component*,Component*,std::_Identity<Component*>,std::less<Component*>,std::allocator<Component*>>
                                *)&local_268,(Component **)p_Var5);
            if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
              Component::QuotedName_abi_cxx11_(&local_290,(Component *)p_Var8[5]._M_nxt);
              poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,local_290._M_dataplus._M_p,local_290._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1," -> ",4);
              Component::QuotedName_abi_cxx11_(&local_2b0,(Component *)p_Var5->_M_nxt);
              poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar1,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1," [color=",8);
              psVar4 = getLinkColor_abi_cxx11_
                                 (local_270,(Component *)p_Var8[5]._M_nxt,
                                  (Component *)p_Var5->_M_nxt);
              poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar1,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];",2);
              local_2b1 = '\n';
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_2b1,1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                operator_delete(local_2b0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._M_dataplus._M_p != &local_290.field_2) {
                operator_delete(local_290._M_dataplus._M_p);
              }
            }
          }
          p_Var7 = p_Var7->_M_nxt;
        } while (p_Var7 != (_Hash_node_base *)0x0);
        p_Var5 = p_Var8[5]._M_nxt;
      }
      for (p_Var5 = p_Var5[10]._M_nxt; p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
        if (((_Hash_node_base *)0x2 < p_Var5[1]._M_nxt[1]._M_nxt) &&
           (p_Var5[1]._M_nxt[0x34]._M_nxt != (_Hash_node_base *)0x0)) {
          p_Var7 = p_Var5 + 1;
          pVar9 = std::
                  _Rb_tree<Component*,Component*,std::_Identity<Component*>,std::less<Component*>,std::allocator<Component*>>
                  ::_M_insert_unique<Component*const&>
                            ((_Rb_tree<Component*,Component*,std::_Identity<Component*>,std::less<Component*>,std::allocator<Component*>>
                              *)&local_268,(Component **)p_Var7);
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
            Component::QuotedName_abi_cxx11_(&local_290,(Component *)p_Var8[5]._M_nxt);
            poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_290._M_dataplus._M_p,local_290._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1," -> ",4);
            Component::QuotedName_abi_cxx11_(&local_2b0,(Component *)p_Var7->_M_nxt);
            poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar1,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1," [color=",8);
            psVar4 = getLinkColor_abi_cxx11_
                               (local_270,(Component *)p_Var8[5]._M_nxt,(Component *)p_Var7->_M_nxt)
            ;
            poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar1,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];",2);
            local_2b1 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_2b1,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p);
            }
          }
        }
      }
      std::
      _Rb_tree<Component_*,_Component_*,_std::_Identity<Component_*>,_std::less<Component_*>,_std::allocator<Component_*>_>
      ::~_Rb_tree((_Rb_tree<Component_*,_Component_*,_std::_Identity<Component_*>,_std::less<Component_*>,_std::allocator<Component_*>_>
                   *)&local_268);
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
  local_268._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_268,1);
  local_238._8_8_ =
       std::ofstream-in-boost::filesystem::basic_ofstream<char,std::char_traits<char>>::
       construction_vtable + 0x18;
  local_138[0] = 0x137d18;
  std::filebuf::~filebuf((filebuf *)(local_238 + 0x10));
  std::ios_base::~ios_base((ios_base *)local_138);
  return;
}

Assistant:

void OutputFlatDependencies(const Configuration& config, std::unordered_map<std::string, Component *> &components, const filesystem::path &outfile) {
    OstreamHolder outHolder(outfile);
    std::ostream& out = outHolder.get();
    out << "digraph dependencies {" << '\n';
    for (const auto &c : components) {
        if (c.second->root.string().size() > 2 &&
            c.second->files.size()) {
            out << "  " << c.second->QuotedName() << " [shape=" << getShapeForSize(c.second) << "];\n";
        }

        std::set<Component *> depcomps;
        for (auto &d : c.second->privDeps) {
            if (d->root.string().size() > 2 &&
                d->files.size()) {
                if (depcomps.insert(d).second) {
                    out << "  " << c.second->QuotedName() << " -> " << d->QuotedName() << " [color="
                        << getLinkColor(config, c.second, d) << "];" << '\n';
                }
            }
        }
        for (auto &d : c.second->pubDeps) {
            if (d->root.string().size() > 2 &&
                d->files.size()) {
                if (depcomps.insert(d).second) {
                    out << "  " << c.second->QuotedName() << " -> " << d->QuotedName() << " [color="
                        << getLinkColor(config, c.second, d) << "];" << '\n';
                }
            }
        }
    }
    out << "}" << '\n';
}